

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O1

Ivy_Store_t * Ivy_CutComputeForNode(Ivy_Man_t *p,Ivy_Obj_t *pObj,int nLeaves)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Ivy_Store_t *extraout_RAX;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  Ivy_Cut_t CutNew;
  Ivy_Cut_t local_54;
  
  lVar10 = 0;
  Ivy_CutComputeForNode::CutStore.nCutsMax = 0x100;
  local_54.nSize = 1;
  local_54.nSizeMax = (short)nLeaves;
  local_54.pArray[0] = pObj->Id << 8;
  Ivy_CutComputeForNode::CutStore.pCuts[0].uHash =
       1 << (((char)(uint)((ulong)((long)local_54.pArray[0] * 0x84210843) >> 0x24) -
             ((char)((uint)pObj->Id >> 0x10) >> 7)) * -0x1f & 0x1fU);
  Ivy_CutComputeForNode::CutStore.nCuts = 1;
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray._8_8_ = local_54.pArray._8_8_;
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray._16_8_ = local_54.pArray._16_8_;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nSize = 1;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nLatches = local_54.nLatches;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nSizeMax = local_54.nSizeMax;
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray[1] = local_54.pArray[1];
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray[0] = local_54.pArray[0];
  lVar8 = 0xdcff48;
  local_54.uHash = Ivy_CutComputeForNode::CutStore.pCuts[0].uHash;
  do {
    if (Ivy_CutComputeForNode::CutStore.pCuts[lVar10].nSize != 0) {
      if (0 < Ivy_CutComputeForNode::CutStore.pCuts[lVar10].nSize) {
        lVar17 = 0;
        do {
          uVar14 = *(uint *)(lVar10 * 0x24 + 0xdcff48 + lVar17 * 4);
          uVar5 = (int)uVar14 >> 8;
          if (((int)uVar5 < 0) || (p->vObjs->nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          piVar4 = (int *)p->vObjs->pArray[uVar5];
          uVar5 = piVar4[2] & 0xf;
          if (((uVar5 != 1) && (uVar5 != 4)) && (*piVar4 != 0)) {
            if (uVar5 - 7 < 0xfffffffe) {
              __assert_fail("Ivy_ObjIsNode(pLeaf)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                            ,0x425,
                            "Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
            }
            uVar14 = uVar14 & 0xff;
            uVar5 = Ivy_CutReadLeaf((Ivy_Obj_t *)(*(ulong *)(piVar4 + 4) & 0xfffffffffffffffe));
            uVar6 = Ivy_CutReadLeaf((Ivy_Obj_t *)(*(ulong *)(piVar4 + 6) & 0xfffffffffffffffe));
            if ((0xfe < (uVar5 & 0xff) + uVar14) || (0xfe < (uVar6 & 0xff) + uVar14)) {
              __assert_fail("nLats + Ivy_LeafLat(iLeaf0) < IVY_LEAF_MASK && nLats + Ivy_LeafLat(iLeaf1) < IVY_LEAF_MASK"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                            ,0x42b,
                            "Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
            }
            iVar9 = uVar5 + uVar14;
            iVar15 = uVar14 + uVar6;
            uVar1 = Ivy_CutComputeForNode::CutStore.pCuts[lVar10].nSize;
            sVar2 = Ivy_CutComputeForNode::CutStore.pCuts[lVar10].nSizeMax;
            if ((short)uVar1 < sVar2) {
LAB_0079745f:
              iVar16 = iVar15;
              if ((int)uVar6 < (int)uVar5) {
                iVar16 = iVar9;
                iVar9 = iVar15;
              }
              if ((short)uVar1 < 1) {
                __assert_fail("pCut->nSize > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                              ,0x2d6,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)"
                             );
              }
              if (iVar16 <= iVar9) {
                __assert_fail("IdNew0 < IdNew1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                              ,0x2d7,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)"
                             );
              }
              iVar15 = *(int *)(lVar10 * 0x24 + 0xdcff48 + lVar17 * 4);
              uVar11 = 0;
              iVar7 = 0;
              uVar14 = 0;
              do {
                iVar3 = *(int *)(lVar8 + uVar11 * 4);
                if (iVar3 != iVar15) {
                  if (iVar9 <= iVar3) {
                    if (iVar9 < iVar3) {
                      lVar13 = (long)iVar7;
                      iVar7 = iVar7 + 1;
                      local_54.pArray[lVar13] = iVar9;
                      uVar14 = uVar14 | 1 << (((uint)((ulong)((long)iVar9 * 0x84210843) >> 0x24) -
                                              (iVar9 >> 0x1f)) * -0x1f + iVar9 & 0x1f);
                    }
                    iVar9 = 0x7fffffff;
                  }
                  iVar12 = iVar16;
                  if ((iVar16 <= iVar3) && (iVar12 = 0x7fffffff, iVar16 < iVar3)) {
                    lVar13 = (long)iVar7;
                    iVar7 = iVar7 + 1;
                    local_54.pArray[lVar13] = iVar16;
                    uVar14 = uVar14 | 1 << (((uint)((ulong)((long)iVar16 * 0x84210843) >> 0x24) -
                                            (iVar16 >> 0x1f)) * -0x1f + iVar16 & 0x1f);
                  }
                  lVar13 = (long)iVar7;
                  iVar7 = iVar7 + 1;
                  local_54.pArray[lVar13] = iVar3;
                  uVar14 = uVar14 | 1 << (((uint)((ulong)((long)iVar3 * 0x84210843) >> 0x24) -
                                          (iVar3 >> 0x1f)) * -0x1f + iVar3 & 0x1f);
                  iVar16 = iVar12;
                }
                uVar11 = uVar11 + 1;
              } while (uVar1 != uVar11);
              if (iVar9 != 0x7fffffff) {
                lVar13 = (long)iVar7;
                iVar7 = iVar7 + 1;
                local_54.pArray[lVar13] = iVar9;
                uVar14 = uVar14 | 1 << (((uint)((ulong)((long)iVar9 * 0x84210843) >> 0x24) -
                                        (iVar9 >> 0x1f)) * -0x1f + iVar9 & 0x1f);
              }
              if (iVar16 != 0x7fffffff) {
                lVar13 = (long)iVar7;
                iVar7 = iVar7 + 1;
                local_54.pArray[lVar13] = iVar16;
                uVar14 = uVar14 | 1 << (((uint)((ulong)((long)iVar16 * 0x84210843) >> 0x24) -
                                        (iVar16 >> 0x1f)) * -0x1f + iVar16 & 0x1f);
              }
              local_54.nSize = (short)iVar7;
              local_54.uHash = uVar14;
              if (sVar2 < local_54.nSize) {
                __assert_fail("pCutNew->nSize <= pCut->nSizeMax",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivySeq.c"
                              ,0x2fd,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)"
                             );
              }
              Ivy_CutFindOrAddFilter(&Ivy_CutComputeForNode::CutStore,&local_54);
              if (Ivy_CutComputeForNode::CutStore.nCuts == 0x100) break;
            }
            else if (0 < (short)uVar1) {
              uVar11 = 0;
              do {
                iVar16 = *(int *)(lVar8 + uVar11 * 4);
                if ((iVar16 == iVar9) || (iVar16 == iVar15)) goto LAB_0079745f;
                uVar11 = uVar11 + 1;
              } while (uVar1 != uVar11);
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < Ivy_CutComputeForNode::CutStore.pCuts[lVar10].nSize);
      }
      if (Ivy_CutComputeForNode::CutStore.nCuts == 0x100) break;
    }
    lVar10 = lVar10 + 1;
    lVar8 = lVar8 + 0x24;
  } while (lVar10 < Ivy_CutComputeForNode::CutStore.nCuts);
  Ivy_CutComputeForNode::CutStore.fSatur = (int)(Ivy_CutComputeForNode::CutStore.nCuts == 0x100);
  Ivy_CutCompactAll(&Ivy_CutComputeForNode::CutStore);
  return extraout_RAX;
}

Assistant:

Ivy_Store_t * Ivy_CutComputeForNode( Ivy_Man_t * p, Ivy_Obj_t * pObj, int nLeaves )
{
    static Ivy_Store_t CutStore, * pCutStore = &CutStore;
    Ivy_Cut_t CutNew, * pCutNew = &CutNew, * pCut;
    Ivy_Obj_t * pLeaf;
    int i, k, Temp, nLats, iLeaf0, iLeaf1;

    assert( nLeaves <= IVY_CUT_INPUT );

    // start the structure
    pCutStore->nCuts = 0;
    pCutStore->nCutsMax = IVY_CUT_LIMIT;
    // start the trivial cut
    pCutNew->uHash = 0;
    pCutNew->nSize = 1;
    pCutNew->nSizeMax = nLeaves;
    pCutNew->pArray[0] = Ivy_LeafCreate( pObj->Id, 0 );
    pCutNew->uHash = Ivy_CutHashValue( pCutNew->pArray[0] );
    // add the trivial cut
    pCutStore->pCuts[pCutStore->nCuts++] = *pCutNew;
    assert( pCutStore->nCuts == 1 );

    // explore the cuts
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        // expand this cut
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        for ( k = 0; k < pCut->nSize; k++ )
        {
            pLeaf = Ivy_ManObj( p, Ivy_LeafId(pCut->pArray[k]) );
            if ( Ivy_ObjIsCi(pLeaf) || Ivy_ObjIsConst1(pLeaf) )
                continue;
            assert( Ivy_ObjIsNode(pLeaf) );
            nLats = Ivy_LeafLat(pCut->pArray[k]);

            // get the fanins fanins
            iLeaf0 = Ivy_CutReadLeaf( Ivy_ObjFanin0(pLeaf) );
            iLeaf1 = Ivy_CutReadLeaf( Ivy_ObjFanin1(pLeaf) );
            assert( nLats + Ivy_LeafLat(iLeaf0) < IVY_LEAF_MASK && nLats + Ivy_LeafLat(iLeaf1) < IVY_LEAF_MASK );
            iLeaf0 = nLats + iLeaf0;
            iLeaf1 = nLats + iLeaf1;
            if ( !Ivy_CutPrescreen( pCut, iLeaf0, iLeaf1 ) )
                continue;
            // the given cut exist
            if ( iLeaf0 > iLeaf1 )
                Temp = iLeaf0, iLeaf0 = iLeaf1, iLeaf1 = Temp;
            // create the new cut
            if ( !Ivy_CutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf0, iLeaf1 ) )
                continue;
            // add the cut
            Ivy_CutFindOrAddFilter( pCutStore, pCutNew );
            if ( pCutStore->nCuts == IVY_CUT_LIMIT )
                break;
        }
        if ( pCutStore->nCuts == IVY_CUT_LIMIT )
            break;
    }
    if ( pCutStore->nCuts == IVY_CUT_LIMIT )
        pCutStore->fSatur = 1;
    else
        pCutStore->fSatur = 0;
//    printf( "%d ", pCutStore->nCuts );
    Ivy_CutCompactAll( pCutStore );
//    printf( "%d \n", pCutStore->nCuts );
//    Ivy_CutPrintForNodes( pCutStore );
    return pCutStore;
}